

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetStatistics
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_STATISTICS *registryStatistics)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  JSON_Status JVar2;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE responseBuffer;
  uchar *puVar4;
  JSON_Value *value;
  JSON_Object *object;
  int iVar5;
  char *pcVar6;
  double dVar7;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0 ||
      registryStatistics == (IOTHUB_REGISTRY_STATISTICS *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar6 = "Input parameter cannot be NULL";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar5 = 0x74b;
LAB_001345ea:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"IoTHubRegistryManager_GetStatistics",iVar5,1,pcVar6);
    return IVar1;
  }
  responseBuffer = BUFFER_new();
  if (responseBuffer == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_ERROR;
    }
    pcVar6 = "BUFFER_new failed for responseBuffer";
    iVar5 = 0x754;
    goto LAB_001345ea;
  }
  IVar1 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_GET_STATISTICS,(char *)0x0,
                              (char *)0x0,(BUFFER_HANDLE)0x0,0,responseBuffer);
  if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
    if (IVar1 == IOTHUB_REGISTRYMANAGER_ERROR) {
      p_Var3 = xlogging_get_log_function();
      IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_GetStatistics",0x759,1,
                  "Failure sending HTTP request for get registry statistics");
      }
    }
    goto LAB_00134793;
  }
  puVar4 = BUFFER_u_char(responseBuffer);
  if (puVar4 == (uchar *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar6 = "BUFFER_u_char failed";
      iVar5 = 0x3db;
LAB_00134733:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseStatisticsJson",iVar5,1,pcVar6);
    }
LAB_00134743:
    object = (JSON_Object *)0x0;
    IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    value = (JSON_Value *)0x0;
  }
  else {
    value = json_parse_string((char *)0x134613);
    if (value == (JSON_Value *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar6 = "json_parse_string failed";
        iVar5 = 0x3e0;
        goto LAB_00134733;
      }
      goto LAB_00134743;
    }
    object = json_value_get_object(value);
    if (object == (JSON_Object *)0x0) {
      p_Var3 = xlogging_get_log_function();
      IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        object = (JSON_Object *)0x0;
      }
      else {
        object = (JSON_Object *)0x0;
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"parseStatisticsJson",0x3e5,1,"json_value_get_object failed");
      }
    }
    else {
      dVar7 = json_object_get_number(object,"totalDeviceCount");
      registryStatistics->totalDeviceCount =
           (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
      dVar7 = json_object_get_number(object,"enabledDeviceCount");
      registryStatistics->enabledDeviceCount =
           (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
      dVar7 = json_object_get_number(object,"disabledDeviceCount");
      registryStatistics->disabledDeviceCount =
           (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
      IVar1 = IOTHUB_REGISTRYMANAGER_OK;
    }
  }
  JVar2 = json_object_clear(object);
  if (JVar2 != 0) {
    p_Var3 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseStatisticsJson",0x3f3,1,"json_object_clear failed");
    }
  }
  json_value_free(value);
LAB_00134793:
  BUFFER_delete(responseBuffer);
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetStatistics(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_STATISTICS* registryStatistics)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (registryStatistics == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        BUFFER_HANDLE responseBuffer;

        if ((responseBuffer = BUFFER_new()) == NULL)
        {
            LogError("BUFFER_new failed for responseBuffer");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_GET_STATISTICS, NULL, NULL, NULL, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
        {
            LogError("Failure sending HTTP request for get registry statistics");
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            result = parseStatisticsJson(responseBuffer, registryStatistics);
        }

        if (responseBuffer != NULL)
        {
            BUFFER_delete(responseBuffer);
        }
    }
    return result;
}